

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  uchar uVar3;
  short sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  byte bVar29;
  short sVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined4 z;
  undefined4 z_00;
  undefined4 z_01;
  stbi_uc sVar38;
  byte bVar39;
  int iVar40;
  stbi__uint32 sVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  stbi__jpeg *psVar45;
  char *pcVar46;
  stbi_uc *psVar47;
  float *data_00;
  void *pvVar48;
  code *pcVar49;
  stbi__context *psVar50;
  uchar *data_01;
  byte *pbVar51;
  uchar *puVar52;
  long lVar53;
  long lVar54;
  byte *pbVar55;
  int extraout_EDX;
  uint uVar56;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *extraout_RDX_04;
  anon_struct_96_18_0d0905d3 *extraout_RDX_05;
  anon_struct_96_18_0d0905d3 *extraout_RDX_06;
  anon_struct_96_18_0d0905d3 *extraout_RDX_07;
  anon_struct_96_18_0d0905d3 *paVar57;
  anon_struct_96_18_0d0905d3 *extraout_RDX_08;
  anon_struct_96_18_0d0905d3 *extraout_RDX_09;
  anon_struct_96_18_0d0905d3 *extraout_RDX_10;
  anon_struct_96_18_0d0905d3 *extraout_RDX_11;
  stbi_uc *extraout_RDX_12;
  stbi_uc *psVar58;
  stbi_uc *extraout_RDX_13;
  stbi_uc *extraout_RDX_14;
  int iVar59;
  ulong uVar60;
  stbi_uc *psVar61;
  int iVar62;
  uint uVar63;
  ulong uVar64;
  short sVar65;
  stbi__uint32 sVar66;
  anon_struct_96_18_0d0905d3 *paVar67;
  ulong uVar68;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  int iVar69;
  stbi__uint32 sVar70;
  int iVar71;
  stbi__context *psVar72;
  short *psVar73;
  int *piVar74;
  uint uVar75;
  ulong uVar76;
  stbi_uc (*pasVar77) [4];
  long in_FS_OFFSET;
  bool bVar78;
  undefined1 auVar79 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_8988;
  uint local_8968;
  uint local_8944;
  uint local_8928;
  uint local_891c;
  uint local_88fc;
  undefined1 local_88f8 [12];
  uint uStack_88ec;
  undefined1 local_88e8 [16];
  int local_88d8;
  stbi__jpeg *local_88d0;
  undefined4 local_88c4;
  anon_struct_96_18_0d0905d3 *local_88c0;
  long local_88b8;
  uint local_88b0;
  int local_88ac;
  stbi__gif local_88a8;
  
  psVar58 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar45 = (stbi__jpeg *)malloc(0x4888);
  psVar45->s = s;
  psVar45->idct_block_kernel = stbi__idct_simd;
  psVar45->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar45->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar45->jfif = 0;
  psVar45->app14_color_transform = -1;
  psVar45->marker = 0xff;
  sVar38 = stbi__get_marker(psVar45);
  if (sVar38 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar45);
  if (sVar38 == 0xd8) {
    psVar45 = (stbi__jpeg *)malloc(0x4888);
    psVar45->s = s;
    psVar45->idct_block_kernel = stbi__idct_simd;
    psVar45->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar45->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar45->img_comp[0].raw_data = (void *)0x0;
      psVar45->img_comp[0].raw_coeff = (void *)0x0;
      psVar45->img_comp[1].raw_data = (void *)0x0;
      psVar45->img_comp[1].raw_coeff = (void *)0x0;
      psVar45->img_comp[2].raw_data = (void *)0x0;
      psVar45->img_comp[2].raw_coeff = (void *)0x0;
      psVar45->img_comp[3].raw_data = (void *)0x0;
      psVar45->img_comp[3].raw_coeff = (void *)0x0;
      psVar45->restart_interval = 0;
      iVar40 = stbi__decode_jpeg_header(psVar45,0);
      paVar57 = extraout_RDX;
      if (iVar40 != 0) {
        paVar1 = psVar45->img_comp;
        bVar39 = stbi__get_marker(psVar45);
LAB_0015a0ce:
        if (bVar39 == 0xda) {
          iVar40 = stbi__get16be(psVar45->s);
          psVar50 = psVar45->s;
          pbVar51 = psVar50->img_buffer;
          paVar57 = extraout_RDX_02;
          if (psVar50->img_buffer_end <= pbVar51) {
            if (psVar50->read_from_callbacks == 0) {
              psVar45->scan_n = 0;
              goto LAB_0015b9ea;
            }
            stbi__refill_buffer(psVar50);
            pbVar51 = psVar50->img_buffer;
            paVar57 = extraout_RDX_03;
          }
          psVar50->img_buffer = pbVar51 + 1;
          bVar39 = *pbVar51;
          psVar45->scan_n = (uint)bVar39;
          if (((0xfb < (byte)(bVar39 - 5)) &&
              (psVar50 = psVar45->s, (int)(uint)bVar39 <= psVar50->img_n)) &&
             (iVar40 == (uint)bVar39 * 2 + 6)) {
            lVar54 = 0;
            psVar72 = psVar50;
            do {
              pbVar55 = psVar72->img_buffer;
              pbVar51 = psVar72->img_buffer_end;
              if (pbVar55 < pbVar51) {
LAB_0015a1df:
                psVar72->img_buffer = pbVar55 + 1;
                uVar75 = (uint)*pbVar55;
                pbVar55 = psVar50->img_buffer;
                pbVar51 = psVar50->img_buffer_end;
                psVar72 = psVar50;
              }
              else {
                if (psVar72->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar72);
                  pbVar55 = psVar72->img_buffer;
                  psVar50 = psVar45->s;
                  goto LAB_0015a1df;
                }
                uVar75 = 0;
              }
              if (pbVar55 < pbVar51) {
LAB_0015a221:
                psVar72->img_buffer = pbVar55 + 1;
                bVar39 = *pbVar55;
                psVar72 = psVar50;
              }
              else {
                if (psVar72->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar72);
                  pbVar55 = psVar72->img_buffer;
                  psVar50 = psVar45->s;
                  goto LAB_0015a221;
                }
                bVar39 = 0;
              }
              iVar40 = psVar72->img_n;
              if ((long)iVar40 < 1) {
                paVar57 = (anon_struct_96_18_0d0905d3 *)0x0;
              }
              else {
                paVar57 = (anon_struct_96_18_0d0905d3 *)0x0;
                paVar67 = paVar1;
                while (paVar67->id != uVar75) {
                  paVar57 = (anon_struct_96_18_0d0905d3 *)((long)&paVar57->id + 1);
                  paVar67 = paVar67 + 1;
                  if ((anon_struct_96_18_0d0905d3 *)(long)iVar40 == paVar57) goto LAB_0015b9fa;
                }
              }
              if ((int)paVar57 == iVar40) goto LAB_0015b9fa;
              psVar45->img_comp[(ulong)paVar57 & 0xffffffff].hd = (uint)(bVar39 >> 4);
              if ((0x3f < bVar39) ||
                 (paVar1[(ulong)paVar57 & 0xffffffff].ha = bVar39 & 0xf, 3 < (bVar39 & 0xf)))
              goto LAB_0015b9ea;
              psVar45->order[lVar54] = (int)paVar57;
              lVar54 = lVar54 + 1;
            } while (lVar54 < psVar45->scan_n);
            pbVar55 = psVar72->img_buffer;
            pbVar51 = psVar72->img_buffer_end;
            if (pbVar55 < pbVar51) {
LAB_0015a2f6:
              psVar72->img_buffer = pbVar55 + 1;
              uVar75 = (uint)*pbVar55;
              pbVar55 = psVar50->img_buffer;
              pbVar51 = psVar50->img_buffer_end;
              psVar72 = psVar50;
            }
            else {
              if (psVar72->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar72);
                pbVar55 = psVar72->img_buffer;
                psVar50 = psVar45->s;
                goto LAB_0015a2f6;
              }
              uVar75 = 0;
            }
            psVar45->spec_start = uVar75;
            if (pbVar55 < pbVar51) {
LAB_0015a340:
              psVar72->img_buffer = pbVar55 + 1;
              uVar75 = (uint)*pbVar55;
              pbVar55 = psVar50->img_buffer;
              pbVar51 = psVar50->img_buffer_end;
              psVar72 = psVar50;
            }
            else {
              if (psVar72->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar72);
                pbVar55 = psVar72->img_buffer;
                psVar50 = psVar45->s;
                goto LAB_0015a340;
              }
              uVar75 = 0;
            }
            psVar45->spec_end = uVar75;
            if (pbVar55 < pbVar51) {
LAB_0015a386:
              psVar72->img_buffer = pbVar55 + 1;
              uVar75 = (uint)*pbVar55;
            }
            else {
              if (psVar72->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar72);
                pbVar55 = psVar72->img_buffer;
                goto LAB_0015a386;
              }
              uVar75 = 0;
            }
            psVar45->succ_high = uVar75 >> 4;
            uVar44 = uVar75 & 0xf;
            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
            psVar45->succ_low = uVar44;
            iVar40 = psVar45->progressive;
            iVar71 = psVar45->spec_start;
            if (iVar40 != 0) {
              if (((iVar71 < 0x40) && (psVar45->spec_end < 0x40)) &&
                 ((iVar71 <= psVar45->spec_end && ((uVar75 < 0xe0 && (uVar44 < 0xe))))))
              goto LAB_0015a40d;
              goto LAB_0015b9ea;
            }
            if (iVar71 != 0 || uVar75 != 0) goto LAB_0015b9ea;
            psVar45->spec_end = 0x3f;
LAB_0015a40d:
            iVar71 = psVar45->scan_n;
            iVar69 = psVar45->restart_interval;
            if (iVar69 == 0) {
              iVar69 = 0x7fffffff;
            }
            psVar45->code_buffer = 0;
            psVar45->code_bits = 0;
            psVar45->nomore = 0;
            psVar45->img_comp[3].dc_pred = 0;
            psVar45->img_comp[2].dc_pred = 0;
            psVar45->img_comp[1].dc_pred = 0;
            psVar45->img_comp[0].dc_pred = 0;
            psVar45->marker = 0xff;
            psVar45->todo = iVar69;
            psVar45->eob_run = 0;
            if (iVar40 == 0) {
              if (iVar71 == 1) {
                iVar40 = psVar45->order[0];
                uVar75 = psVar45->img_comp[iVar40].y + 7 >> 3;
                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar75;
                bVar78 = true;
                if (0 < (int)uVar75) {
                  uVar63 = paVar1[iVar40].x + 7 >> 3;
                  iVar71 = 0;
                  uVar44 = 0;
                  do {
                    if (0 < (int)uVar63) {
                      lVar54 = 0;
                      do {
                        iVar69 = stbi__jpeg_decode_block
                                           (psVar45,(short *)&local_88a8,
                                            (stbi__huffman *)
                                            psVar45->huff_dc[paVar1[iVar40].hd].fast,
                                            (stbi__huffman *)
                                            psVar45->huff_ac[paVar1[iVar40].ha].fast,
                                            psVar45->fast_ac[paVar1[iVar40].ha],iVar40,
                                            psVar45->dequant[paVar1[iVar40].tq]);
                        paVar57 = extraout_RDX_05;
                        if (iVar69 == 0) goto LAB_0015b2d3;
                        (*psVar45->idct_block_kernel)
                                  (paVar1[iVar40].data + lVar54 + iVar71 * paVar1[iVar40].w2,
                                   paVar1[iVar40].w2,(short *)&local_88a8);
                        iVar69 = psVar45->todo;
                        psVar45->todo = iVar69 + -1;
                        paVar57 = extraout_RDX_06;
                        if (iVar69 < 2) {
                          if (psVar45->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar45);
                            paVar57 = extraout_RDX_07;
                          }
                          if ((psVar45->marker & 0xf8) != 0xd0) goto LAB_0015b2cc;
                          psVar45->code_buffer = 0;
                          psVar45->code_bits = 0;
                          psVar45->nomore = 0;
                          psVar45->img_comp[3].dc_pred = 0;
                          psVar45->img_comp[2].dc_pred = 0;
                          psVar45->img_comp[1].dc_pred = 0;
                          psVar45->img_comp[0].dc_pred = 0;
                          psVar45->marker = 0xff;
                          iVar69 = psVar45->restart_interval;
                          paVar57 = (anon_struct_96_18_0d0905d3 *)0x7fffffff;
                          if (iVar69 == 0) {
                            iVar69 = 0x7fffffff;
                          }
                          psVar45->todo = iVar69;
                          psVar45->eob_run = 0;
                        }
                        lVar54 = lVar54 + 8;
                      } while ((ulong)uVar63 * 8 != lVar54);
                    }
                    uVar44 = uVar44 + 1;
                    iVar71 = iVar71 + 8;
                  } while (uVar44 != uVar75);
LAB_0015b2cc:
                  bVar78 = true;
                }
              }
              else {
                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar45->img_mcu_y;
                bVar78 = true;
                if (0 < psVar45->img_mcu_y) {
                  iVar40 = psVar45->img_mcu_x;
                  iVar71 = 0;
                  do {
                    if (0 < iVar40) {
                      uVar75 = 0;
                      do {
                        iVar40 = psVar45->scan_n;
                        if (0 < iVar40) {
                          lVar54 = 0;
                          do {
                            iVar69 = psVar45->order[lVar54];
                            iVar42 = psVar45->img_comp[iVar69].v;
                            paVar57 = paVar1;
                            if (0 < iVar42) {
                              iVar40 = paVar1[iVar69].h;
                              iVar59 = 0;
                              do {
                                if (0 < iVar40) {
                                  iVar42 = 0;
                                  do {
                                    iVar62 = paVar1[iVar69].v;
                                    iVar43 = stbi__jpeg_decode_block
                                                       (psVar45,(short *)&local_88a8,
                                                        (stbi__huffman *)
                                                        psVar45->huff_dc[paVar1[iVar69].hd].fast,
                                                        (stbi__huffman *)
                                                        psVar45->huff_ac[paVar1[iVar69].ha].fast,
                                                        psVar45->fast_ac[paVar1[iVar69].ha],iVar69,
                                                        psVar45->dequant[paVar1[iVar69].tq]);
                                    paVar57 = extraout_RDX_09;
                                    if (iVar43 == 0) goto LAB_0015b2d3;
                                    (*psVar45->idct_block_kernel)
                                              (paVar1[iVar69].data +
                                               (long)(int)((iVar40 * uVar75 + iVar42) * 8) +
                                               (long)((iVar62 * iVar71 + iVar59) * paVar1[iVar69].w2
                                                     * 8),paVar1[iVar69].w2,(short *)&local_88a8);
                                    iVar42 = iVar42 + 1;
                                    iVar40 = paVar1[iVar69].h;
                                  } while (iVar42 < iVar40);
                                  iVar42 = paVar1[iVar69].v;
                                  paVar57 = extraout_RDX_10;
                                }
                                iVar59 = iVar59 + 1;
                              } while (iVar59 < iVar42);
                              iVar40 = psVar45->scan_n;
                            }
                            lVar54 = lVar54 + 1;
                          } while (lVar54 < iVar40);
                          iVar69 = psVar45->todo;
                        }
                        psVar45->todo = iVar69 + -1;
                        bVar78 = iVar69 < 2;
                        iVar69 = iVar69 + -1;
                        if (bVar78) {
                          if (psVar45->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar45);
                            paVar57 = extraout_RDX_11;
                          }
                          if ((psVar45->marker & 0xf8) != 0xd0) goto LAB_0015b2cc;
                          psVar45->code_buffer = 0;
                          psVar45->code_bits = 0;
                          psVar45->nomore = 0;
                          psVar45->img_comp[3].dc_pred = 0;
                          psVar45->img_comp[2].dc_pred = 0;
                          psVar45->img_comp[1].dc_pred = 0;
                          psVar45->img_comp[0].dc_pred = 0;
                          psVar45->marker = 0xff;
                          iVar69 = psVar45->restart_interval;
                          if (iVar69 == 0) {
                            iVar69 = 0x7fffffff;
                          }
                          psVar45->todo = iVar69;
                          psVar45->eob_run = 0;
                        }
                        uVar75 = uVar75 + 1;
                        paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar75;
                        iVar40 = psVar45->img_mcu_x;
                      } while ((int)uVar75 < iVar40);
                      paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar45->img_mcu_y;
                    }
                    iVar71 = iVar71 + 1;
                  } while (iVar71 < (int)paVar57);
                  goto LAB_0015b2cc;
                }
              }
              goto LAB_0015b2d5;
            }
            if (iVar71 == 1) {
              local_88b8 = (long)psVar45->order[0];
              iVar40 = psVar45->img_comp[local_88b8].y + 7 >> 3;
              if (0 < iVar40) {
                local_88c0 = paVar1 + local_88b8;
                iVar71 = psVar45->img_comp[local_88b8].x + 7 >> 3;
                local_8944 = 0;
                do {
                  if (0 < iVar71) {
                    iVar69 = 0;
                    do {
                      psVar73 = local_88c0->coeff +
                                (int)((local_88c0->coeff_w * local_8944 + iVar69) * 0x40);
                      uVar60 = (ulong)psVar45->spec_start;
                      if (uVar60 == 0) {
                        iVar42 = stbi__jpeg_decode_block_prog_dc
                                           (psVar45,psVar73,
                                            (stbi__huffman *)psVar45->huff_dc[local_88c0->hd].fast,
                                            (int)local_88b8);
                        paVar57 = extraout_RDX_04;
                        if (iVar42 == 0) goto LAB_0015b9fa;
                      }
                      else {
                        iVar42 = local_88c0->ha;
                        iVar59 = psVar45->eob_run;
                        bVar39 = (byte)psVar45->succ_low;
                        if (psVar45->succ_high == 0) {
                          if (iVar59 == 0) {
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar45->code_bits;
                            do {
                              if ((int)paVar57 < 0x10) {
                                stbi__grow_buffer_unsafe(psVar45);
                              }
                              uVar75 = psVar45->code_buffer;
                              uVar68 = (ulong)(uVar75 >> 0x17);
                              sVar65 = psVar45->fast_ac[iVar42][uVar68];
                              uVar44 = (uint)sVar65;
                              iVar59 = (int)uVar60;
                              if (sVar65 == 0) {
                                if (psVar45->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar45);
                                  uVar75 = psVar45->code_buffer;
                                  uVar68 = (ulong)(uVar75 >> 0x17);
                                }
                                uVar60 = (ulong)psVar45->huff_ac[iVar42].fast[uVar68];
                                if (uVar60 == 0xff) {
                                  lVar54 = 0;
                                  do {
                                    lVar53 = lVar54;
                                    lVar54 = lVar53 + 1;
                                  } while (psVar45->huff_ac[iVar42].maxcode[lVar53 + 10] <=
                                           uVar75 >> 0x10);
                                  uVar44 = psVar45->code_bits;
                                  paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
                                  if (lVar54 == 8) goto LAB_0015c68f;
                                  if ((int)uVar44 < (int)(lVar53 + 10)) goto LAB_0015b9ea;
                                  uVar60 = (ulong)(int)((uVar75 >> (0x17U - (char)lVar54 & 0x1f) &
                                                        stbi__bmask[lVar53 + 10]) +
                                                       psVar45->huff_ac[iVar42].delta[lVar53 + 10]);
                                  bVar2 = psVar45->huff_ac[iVar42].size[uVar60];
                                  if ((uVar75 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                      (uint)psVar45->huff_ac[iVar42].code[uVar60])
                                  goto LAB_0015d404;
                                  uVar44 = (uVar44 - (int)lVar54) - 9;
                                  paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
                                  psVar45->code_bits = uVar44;
                                  sVar41 = uVar75 << ((byte)(lVar53 + 10) & 0x1f);
                                  psVar45->code_buffer = sVar41;
                                }
                                else {
                                  bVar2 = psVar45->huff_ac[iVar42].size[uVar60];
                                  uVar44 = psVar45->code_bits - (uint)bVar2;
                                  paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
                                  if (psVar45->code_bits < (int)(uint)bVar2) goto LAB_0015b9ea;
                                  sVar41 = uVar75 << (bVar2 & 0x1f);
                                  psVar45->code_buffer = sVar41;
                                  psVar45->code_bits = uVar44;
                                }
                                bVar2 = psVar45->huff_ac[iVar42].values[uVar60];
                                uVar44 = bVar2 & 0xf;
                                bVar29 = bVar2 >> 4;
                                uVar75 = (uint)bVar29;
                                iVar62 = (int)paVar57;
                                if ((bVar2 & 0xf) == 0) {
                                  if (bVar2 < 0xf0) {
                                    iVar59 = 1 << bVar29;
                                    psVar45->eob_run = iVar59;
                                    if (0xf < bVar2) {
                                      if (iVar62 < (int)uVar75) {
                                        stbi__grow_buffer_unsafe(psVar45);
                                        sVar41 = psVar45->code_buffer;
                                        iVar62 = psVar45->code_bits;
                                        iVar59 = psVar45->eob_run;
                                      }
                                      uVar63 = sVar41 << bVar29 | sVar41 >> 0x20 - bVar29;
                                      uVar44 = stbi__bmask[uVar75];
                                      psVar45->code_buffer = ~uVar44 & uVar63;
                                      iVar59 = iVar59 + (uVar63 & uVar44);
                                      psVar45->code_bits = iVar62 - uVar75;
                                    }
                                    goto LAB_0015a654;
                                  }
                                  uVar60 = (ulong)(iVar59 + 0x10);
                                }
                                else {
                                  lVar54 = (long)iVar59 + (ulong)uVar75;
                                  bVar2 = ""[lVar54];
                                  if (iVar62 < (int)uVar44) {
                                    stbi__grow_buffer_unsafe(psVar45);
                                    sVar41 = psVar45->code_buffer;
                                    iVar62 = psVar45->code_bits;
                                  }
                                  uVar63 = sVar41 << (sbyte)uVar44 | sVar41 >> 0x20 - (sbyte)uVar44;
                                  uVar75 = *(uint *)((long)stbi__bmask + (ulong)(uVar44 * 4));
                                  psVar45->code_buffer = ~uVar75 & uVar63;
                                  paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar62 - uVar44);
                                  psVar45->code_bits = iVar62 - uVar44;
                                  iVar59 = 0;
                                  if (-1 < (int)sVar41) {
                                    iVar59 = *(int *)((long)stbi__jbias + (ulong)(uVar44 * 4));
                                  }
                                  uVar60 = (ulong)((int)lVar54 + 1);
                                  psVar73[bVar2] =
                                       (short)((uVar63 & uVar75) + iVar59 << (bVar39 & 0x1f));
                                }
                              }
                              else {
                                lVar54 = (long)iVar59 + (ulong)(uVar44 >> 4 & 0xf);
                                psVar45->code_buffer = uVar75 << (sbyte)(uVar44 & 0xf);
                                uVar75 = psVar45->code_bits - (uVar44 & 0xf);
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar75;
                                psVar45->code_bits = uVar75;
                                uVar60 = (ulong)((int)lVar54 + 1);
                                psVar73[""[lVar54]] = (short)((uVar44 >> 8) << (bVar39 & 0x1f));
                              }
                            } while ((int)uVar60 <= psVar45->spec_end);
                          }
                          else {
LAB_0015a654:
                            psVar45->eob_run = iVar59 + -1;
                          }
                        }
                        else if (iVar59 == 0) {
                          iVar59 = 0x10000 << (bVar39 & 0x1f);
                          paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar45->code_bits;
                          do {
                            if ((int)paVar57 < 0x10) {
                              stbi__grow_buffer_unsafe(psVar45);
                            }
                            uVar75 = psVar45->code_buffer;
                            uVar68 = (ulong)psVar45->huff_ac[iVar42].fast[uVar75 >> 0x17];
                            if (uVar68 == 0xff) {
                              lVar54 = 0;
                              do {
                                lVar53 = lVar54;
                                lVar54 = lVar53 + 1;
                              } while (psVar45->huff_ac[iVar42].maxcode[lVar53 + 10] <=
                                       uVar75 >> 0x10);
                              uVar44 = psVar45->code_bits;
                              paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
                              if (lVar54 == 8) goto LAB_0015c68f;
                              if ((int)uVar44 < (int)(lVar53 + 10)) goto LAB_0015b9ea;
                              uVar68 = (ulong)(int)((uVar75 >> (0x17U - (char)lVar54 & 0x1f) &
                                                    stbi__bmask[lVar53 + 10]) +
                                                   psVar45->huff_ac[iVar42].delta[lVar53 + 10]);
                              bVar2 = psVar45->huff_ac[iVar42].size[uVar68];
                              if ((uVar75 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                  (uint)psVar45->huff_ac[iVar42].code[uVar68]) {
LAB_0015d404:
                                __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                                              ,0x81a,
                                              "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                             );
                              }
                              uVar44 = (uVar44 - (int)lVar54) - 9;
                              paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
                              psVar45->code_bits = uVar44;
                              sVar41 = uVar75 << ((byte)(lVar53 + 10) & 0x1f);
                              psVar45->code_buffer = sVar41;
                            }
                            else {
                              bVar2 = psVar45->huff_ac[iVar42].size[uVar68];
                              uVar44 = psVar45->code_bits - (uint)bVar2;
                              paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar44;
                              if (psVar45->code_bits < (int)(uint)bVar2) goto LAB_0015b9ea;
                              sVar41 = uVar75 << (bVar2 & 0x1f);
                              psVar45->code_buffer = sVar41;
                              psVar45->code_bits = uVar44;
                            }
                            iVar62 = (int)paVar57;
                            bVar2 = psVar45->huff_ac[iVar42].values[uVar68];
                            bVar29 = bVar2 >> 4;
                            uVar75 = (uint)bVar29;
                            uVar68 = (ulong)uVar75;
                            if ((bVar2 & 0xf) == 1) {
                              if (iVar62 < 1) {
                                stbi__grow_buffer_unsafe(psVar45);
                                sVar41 = psVar45->code_buffer;
                                iVar62 = psVar45->code_bits;
                              }
                              sVar66 = sVar41 * 2;
                              psVar45->code_buffer = sVar66;
                              paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar62 - 1U);
                              sVar65 = (short)(((int)~sVar41 >> 0x1f | 1U) << (bVar39 & 0x1f));
                              psVar45->code_bits = iVar62 - 1U;
                            }
                            else {
                              if ((bVar2 & 0xf) != 0) goto LAB_0015b9ea;
                              if (bVar2 < 0xf0) {
                                uVar44 = ~(-1 << bVar29);
                                psVar45->eob_run = uVar44;
                                uVar64 = 0x40;
                                if (0xf < bVar2) {
                                  if (iVar62 < (int)uVar75) {
                                    stbi__grow_buffer_unsafe(psVar45);
                                    sVar41 = psVar45->code_buffer;
                                    iVar62 = psVar45->code_bits;
                                    uVar44 = psVar45->eob_run;
                                  }
                                  uVar56 = sVar41 << bVar29 | sVar41 >> 0x20 - bVar29;
                                  uVar63 = stbi__bmask[uVar68];
                                  sVar66 = ~uVar63 & uVar56;
                                  psVar45->code_buffer = sVar66;
                                  paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar62 - uVar75);
                                  psVar45->code_bits = iVar62 - uVar75;
                                  psVar45->eob_run = (uVar56 & uVar63) + uVar44;
                                  sVar65 = 0;
                                  uVar68 = uVar64;
                                  goto LAB_0015a889;
                                }
                              }
                              else {
                                uVar64 = 0xf;
                              }
                              sVar65 = 0;
                              uVar68 = uVar64;
                              sVar66 = sVar41;
                            }
LAB_0015a889:
                            uVar75 = psVar45->spec_end;
                            uVar64 = (ulong)uVar75;
                            if ((int)uVar60 <= (int)uVar75) {
                              uVar76 = (long)(int)uVar60;
                              do {
                                uVar75 = (uint)uVar64;
                                iVar62 = (int)paVar57;
                                bVar2 = ""[uVar76];
                                if (psVar73[bVar2] == 0) {
                                  if ((int)uVar68 == 0) {
                                    uVar60 = (ulong)((int)uVar76 + 1);
                                    psVar73[bVar2] = sVar65;
                                    break;
                                  }
                                  uVar68 = (ulong)((int)uVar68 - 1);
                                }
                                else {
                                  if (iVar62 < 1) {
                                    stbi__grow_buffer_unsafe(psVar45);
                                    sVar66 = psVar45->code_buffer;
                                    iVar62 = psVar45->code_bits;
                                  }
                                  sVar41 = sVar66 * 2;
                                  psVar45->code_buffer = sVar41;
                                  paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar62 - 1U);
                                  psVar45->code_bits = iVar62 - 1U;
                                  bVar78 = (int)sVar66 < 0;
                                  sVar66 = sVar41;
                                  if ((bVar78) &&
                                     (sVar4 = psVar73[bVar2], (iVar59 >> 0x10 & (int)sVar4) == 0)) {
                                    sVar30 = (short)((uint)iVar59 >> 0x10);
                                    if (sVar4 < 1) {
                                      sVar30 = -sVar30;
                                    }
                                    psVar73[bVar2] = sVar4 + sVar30;
                                  }
                                }
                                uVar60 = uVar76 + 1;
                                uVar75 = psVar45->spec_end;
                                uVar64 = (ulong)(int)uVar75;
                                bVar78 = (long)uVar76 < (long)uVar64;
                                uVar76 = uVar60;
                              } while (bVar78);
                            }
                          } while ((int)uVar60 <= (int)uVar75);
                        }
                        else {
                          psVar45->eob_run = iVar59 + -1;
                          if (psVar45->spec_start <= psVar45->spec_end) {
                            uVar75 = (0x10000 << (bVar39 & 0x1f)) >> 0x10;
                            do {
                              bVar39 = ""[uVar60];
                              if (psVar73[bVar39] != 0) {
                                iVar42 = psVar45->code_bits;
                                if (iVar42 < 1) {
                                  stbi__grow_buffer_unsafe(psVar45);
                                  iVar42 = psVar45->code_bits;
                                }
                                sVar41 = psVar45->code_buffer;
                                psVar45->code_buffer = sVar41 * 2;
                                psVar45->code_bits = iVar42 + -1;
                                if (((int)sVar41 < 0) &&
                                   (sVar65 = psVar73[bVar39], (uVar75 & (int)sVar65) == 0)) {
                                  uVar44 = -uVar75;
                                  if (0 < sVar65) {
                                    uVar44 = uVar75;
                                  }
                                  psVar73[bVar39] = (short)uVar44 + sVar65;
                                }
                              }
                              bVar78 = (long)uVar60 < (long)psVar45->spec_end;
                              uVar60 = uVar60 + 1;
                            } while (bVar78);
                          }
                        }
                      }
                      iVar42 = psVar45->todo;
                      psVar45->todo = iVar42 + -1;
                      if (iVar42 < 2) {
                        if (psVar45->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar45);
                        }
                        bVar39 = psVar45->marker;
                        if ((bVar39 & 0xf8) != 0xd0) goto LAB_0015b2e5;
                        psVar45->code_buffer = 0;
                        psVar45->code_bits = 0;
                        psVar45->nomore = 0;
                        psVar45->img_comp[3].dc_pred = 0;
                        psVar45->img_comp[2].dc_pred = 0;
                        psVar45->img_comp[1].dc_pred = 0;
                        psVar45->img_comp[0].dc_pred = 0;
                        psVar45->marker = 0xff;
                        iVar42 = psVar45->restart_interval;
                        if (iVar42 == 0) {
                          iVar42 = 0x7fffffff;
                        }
                        psVar45->todo = iVar42;
                        psVar45->eob_run = 0;
                      }
                      iVar69 = iVar69 + 1;
                    } while (iVar69 != iVar71);
                  }
                  local_8944 = local_8944 + 1;
                } while (local_8944 != iVar40);
              }
            }
            else {
              iVar40 = psVar45->img_mcu_y;
              if (0 < iVar40) {
                iVar71 = psVar45->img_mcu_x;
                iVar42 = 0;
                do {
                  if (0 < iVar71) {
                    iVar40 = 0;
                    do {
                      iVar71 = psVar45->scan_n;
                      if (0 < iVar71) {
                        lVar54 = 0;
                        do {
                          iVar69 = psVar45->order[lVar54];
                          iVar59 = psVar45->img_comp[iVar69].v;
                          if (0 < iVar59) {
                            iVar71 = paVar1[iVar69].h;
                            iVar62 = 0;
                            do {
                              if (0 < iVar71) {
                                iVar59 = 0;
                                do {
                                  iVar71 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar45,paVar1[iVar69].coeff +
                                                              (iVar71 * iVar40 + iVar59 +
                                                              (paVar1[iVar69].v * iVar42 + iVar62) *
                                                              paVar1[iVar69].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar45->huff_dc[paVar1[iVar69].hd].fast,
                                                      iVar69);
                                  paVar57 = extraout_RDX_08;
                                  if (iVar71 == 0) goto LAB_0015b9fa;
                                  iVar59 = iVar59 + 1;
                                  iVar71 = paVar1[iVar69].h;
                                } while (iVar59 < iVar71);
                                iVar59 = paVar1[iVar69].v;
                              }
                              iVar62 = iVar62 + 1;
                            } while (iVar62 < iVar59);
                            iVar71 = psVar45->scan_n;
                          }
                          lVar54 = lVar54 + 1;
                        } while (lVar54 < iVar71);
                        iVar69 = psVar45->todo;
                      }
                      psVar45->todo = iVar69 + -1;
                      bVar78 = iVar69 < 2;
                      iVar69 = iVar69 + -1;
                      if (bVar78) {
                        if (psVar45->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar45);
                        }
                        bVar39 = psVar45->marker;
                        if ((bVar39 & 0xf8) != 0xd0) goto LAB_0015b2e5;
                        psVar45->code_buffer = 0;
                        psVar45->code_bits = 0;
                        psVar45->nomore = 0;
                        psVar45->img_comp[3].dc_pred = 0;
                        psVar45->img_comp[2].dc_pred = 0;
                        psVar45->img_comp[1].dc_pred = 0;
                        psVar45->img_comp[0].dc_pred = 0;
                        psVar45->marker = 0xff;
                        iVar69 = psVar45->restart_interval;
                        if (iVar69 == 0) {
                          iVar69 = 0x7fffffff;
                        }
                        psVar45->todo = iVar69;
                        psVar45->eob_run = 0;
                      }
                      iVar40 = iVar40 + 1;
                      iVar71 = psVar45->img_mcu_x;
                    } while (iVar40 < iVar71);
                    iVar40 = psVar45->img_mcu_y;
                  }
                  iVar42 = iVar42 + 1;
                } while (iVar42 < iVar40);
              }
            }
            goto LAB_0015b2dd;
          }
          goto LAB_0015b9ea;
        }
        uVar75 = (uint)bVar39;
        if (uVar75 == 0xdc) {
          iVar40 = stbi__get16be(psVar45->s);
          sVar41 = stbi__get16be(psVar45->s);
          paVar57 = extraout_RDX_01;
          if ((iVar40 != 4) || (sVar41 != psVar45->s->img_y)) goto LAB_0015b9ea;
          goto LAB_0015a126;
        }
        if (uVar75 == 0xd9) {
          psVar72 = psVar45->s;
          uVar75 = psVar72->img_n;
          if (psVar45->progressive == 0) goto LAB_0015b89c;
          if (0 < (int)uVar75) {
            lVar54 = 0;
            do {
              iVar40 = psVar45->img_comp[lVar54].y + 7 >> 3;
              if (0 < iVar40) {
                uVar75 = paVar1[lVar54].x + 7 >> 3;
                iVar71 = 0;
                do {
                  if (0 < (int)uVar75) {
                    uVar60 = 0;
                    do {
                      psVar73 = paVar1[lVar54].coeff +
                                (paVar1[lVar54].coeff_w * iVar71 + (int)uVar60) * 0x40;
                      iVar69 = paVar1[lVar54].tq;
                      lVar53 = 0;
                      do {
                        psVar73[lVar53] = psVar73[lVar53] * psVar45->dequant[iVar69][lVar53];
                        lVar53 = lVar53 + 1;
                      } while (lVar53 != 0x40);
                      (*psVar45->idct_block_kernel)
                                (paVar1[lVar54].data +
                                 uVar60 * 8 + (long)(iVar71 * 8 * paVar1[lVar54].w2),
                                 paVar1[lVar54].w2,psVar73);
                      uVar60 = uVar60 + 1;
                    } while (uVar60 != uVar75);
                  }
                  iVar71 = iVar71 + 1;
                } while (iVar71 != iVar40);
                psVar72 = psVar45->s;
              }
              lVar54 = lVar54 + 1;
              uVar75 = psVar72->img_n;
            } while (lVar54 < (int)uVar75);
LAB_0015b89c:
            uVar44 = (2 < (int)uVar75) + 1 + (uint)(2 < (int)uVar75);
            if (req_comp != 0) {
              uVar44 = req_comp;
            }
            if (uVar75 == 3) {
              bVar78 = true;
              uVar63 = 3;
              if (psVar45->rgb != 3) {
                uVar75 = 3;
                if (psVar45->app14_color_transform != 0) goto LAB_0015bb62;
                bVar78 = psVar45->jfif == 0;
              }
            }
            else {
LAB_0015bb62:
              uVar63 = uVar75;
              bVar78 = false;
            }
            uVar75 = 1;
            if (bVar78) {
              uVar75 = uVar63;
            }
            if (uVar63 != 3) {
              uVar75 = uVar63;
            }
            if (2 < (int)uVar44) {
              uVar75 = uVar63;
            }
            local_88e8 = (undefined1  [16])0x0;
            _local_88f8 = (undefined1  [16])0x0;
            sVar41 = psVar72->img_x;
            if (0 < (int)uVar75) {
              lVar54 = 0;
              while( true ) {
                pvVar48 = malloc((ulong)(sVar41 + 3));
                *(void **)((long)&psVar45->img_comp[0].linebuf + lVar54 * 2) = pvVar48;
                iVar40 = extraout_EDX;
                if (pvVar48 == (void *)0x0) break;
                uVar60 = (long)psVar45->img_h_max /
                         (long)*(int *)((long)&psVar45->img_comp[0].h + lVar54 * 2);
                iVar40 = (int)uVar60;
                *(int *)((long)(local_88a8.pal + -7) + lVar54) = iVar40;
                iVar71 = psVar45->img_v_max / *(int *)((long)&psVar45->img_comp[0].v + lVar54 * 2);
                *(int *)((long)(local_88a8.pal + -6) + lVar54) = iVar71;
                *(int *)((long)(local_88a8.pal + -4) + lVar54) = iVar71 >> 1;
                *(int *)((long)(local_88a8.pal + -5) + lVar54) =
                     (int)((ulong)((sVar41 - 1) + iVar40) / (uVar60 & 0xffffffff));
                *(undefined4 *)((long)(local_88a8.pal + -3) + lVar54) = 0;
                uVar7 = *(undefined8 *)((long)&psVar45->img_comp[0].data + lVar54 * 2);
                *(undefined8 *)((long)(local_88a8.pal + -9) + lVar54) = uVar7;
                *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar54) = uVar7;
                if (iVar40 == 2) {
                  pcVar49 = stbi__resample_row_h_2;
                  if (iVar71 != 1) {
                    if (iVar71 != 2) goto LAB_0015bca6;
                    pcVar49 = psVar45->resample_row_hv_2_kernel;
                  }
                }
                else if (iVar40 == 1) {
                  pcVar49 = stbi__resample_row_generic;
                  if (iVar71 == 2) {
                    pcVar49 = stbi__resample_row_v_2;
                  }
                  if (iVar71 == 1) {
                    pcVar49 = resample_row_1;
                  }
                }
                else {
LAB_0015bca6:
                  pcVar49 = stbi__resample_row_generic;
                }
                *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar54) = pcVar49;
                lVar54 = lVar54 + 0x30;
                if ((ulong)uVar75 * 0x30 == lVar54) goto LAB_0015bcc2;
              }
LAB_0015c3da:
              stbi__free_jpeg_components(psVar45,uVar63,iVar40);
              pcVar46 = "Out of memory";
              goto LAB_00159fc7;
            }
LAB_0015bcc2:
            sVar66 = psVar72->img_y;
            psVar50 = (stbi__context *)stbi__malloc_mad3(uVar44,sVar41,sVar66,1);
            iVar40 = (int)extraout_RDX_12;
            if (psVar50 == (stbi__context *)0x0) goto LAB_0015c3da;
            if (sVar66 != 0) {
              paVar57 = psVar45->img_comp;
              iVar71 = 0;
              uVar63 = 0;
              psVar58 = extraout_RDX_12;
              local_88d0 = psVar45;
              do {
                sVar41 = psVar72->img_x;
                if (0 < (int)uVar75) {
                  pasVar77 = (stbi_uc (*) [4])&local_88a8.ratio;
                  uVar60 = 0;
                  piVar74 = &paVar57->y;
                  do {
                    asVar5 = pasVar77[-1];
                    asVar6 = pasVar77[-3];
                    iVar40 = (int)asVar6 >> 1;
                    auVar117 = (**(code **)(pasVar77 + -10))
                                         (*(stbi_uc **)(piVar74 + 10),
                                          *(undefined8 *)
                                           (*pasVar77 +
                                           ((ulong)(iVar40 <= (int)asVar5) << 3 | 0xffffffffffffffe0
                                           )),*(undefined8 *)
                                               (*pasVar77 +
                                               ((ulong)((int)asVar5 < iVar40) << 3 |
                                               0xffffffffffffffe0)),pasVar77[-2],pasVar77[-4]);
                    psVar58 = auVar117._8_8_;
                    *(long *)(local_88f8 + uVar60 * 8) = auVar117._0_8_;
                    pasVar77[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                    if ((int)asVar6 <= (int)asVar5 + 1) {
                      pasVar77[-1] = (stbi_uc  [4])0x0;
                      *(stbi_uc **)(pasVar77 + -8) = *(stbi_uc **)(pasVar77 + -6);
                      asVar5 = *pasVar77;
                      *pasVar77 = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar5 + 1 < *piVar74) {
                        *(stbi_uc **)(pasVar77 + -6) = *(stbi_uc **)(pasVar77 + -6) + piVar74[1];
                      }
                    }
                    uVar60 = uVar60 + 1;
                    piVar74 = piVar74 + 0x18;
                    pasVar77 = pasVar77 + 0xc;
                  } while (uVar75 != uVar60);
                }
                psVar45 = local_88d0;
                if ((int)uVar44 < 3) {
                  psVar72 = local_88d0->s;
                  if (bVar78) {
                    if (uVar44 == 1) {
                      if (psVar72->img_x != 0) {
                        uVar60 = 0;
                        do {
                          bVar39 = *(byte *)(local_88e8._0_8_ + uVar60);
                          psVar50->buffer_start[uVar60 + sVar41 * iVar71 + -0x38] =
                               (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                         (uint)stack0xffffffffffff7710[uVar60] * 0x96 +
                                         (uint)*(byte *)(local_88f8._0_8_ + uVar60) * 0x4d >> 8);
                          uVar60 = uVar60 + 1;
                          psVar58 = (stbi_uc *)local_88e8._0_8_;
                        } while (uVar60 < psVar72->img_x);
                      }
                    }
                    else if (psVar72->img_x != 0) {
                      uVar60 = 0;
                      do {
                        bVar39 = *(byte *)(local_88e8._0_8_ + uVar60);
                        psVar50->buffer_start[uVar60 * 2 + (ulong)(sVar41 * iVar71) + -0x38] =
                             (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                       (uint)stack0xffffffffffff7710[uVar60] * 0x96 +
                                       (uint)*(byte *)(local_88f8._0_8_ + uVar60) * 0x4d >> 8);
                        psVar50->buffer_start[uVar60 * 2 + (ulong)(sVar41 * iVar71) + -0x37] = 0xff;
                        uVar60 = uVar60 + 1;
                        psVar58 = (stbi_uc *)local_88e8._0_8_;
                      } while (uVar60 < psVar72->img_x);
                    }
                  }
                  else if (psVar72->img_n == 4) {
                    if (local_88d0->app14_color_transform == 2) {
                      if (psVar72->img_x != 0) {
                        psVar61 = psVar50->buffer_start + ((ulong)(sVar41 * iVar71) - 0x37);
                        psVar58 = (stbi_uc *)0x0;
                        do {
                          iVar40 = (*(byte *)(local_88f8._0_8_ + (long)psVar58) ^ 0xff) *
                                   (uint)psVar58[local_88e8._8_8_];
                          psVar61[-1] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          *psVar61 = 0xff;
                          psVar58 = psVar58 + 1;
                          psVar61 = psVar61 + uVar44;
                        } while (psVar58 < (stbi_uc *)(ulong)psVar72->img_x);
                      }
                    }
                    else {
                      if (local_88d0->app14_color_transform != 0) goto LAB_0015c123;
                      if (psVar72->img_x != 0) {
                        psVar61 = psVar50->buffer_start + ((ulong)(sVar41 * iVar71) - 0x37);
                        uVar60 = 0;
                        do {
                          bVar39 = *(byte *)(local_88e8._8_8_ + uVar60);
                          iVar40 = (uint)*(byte *)(local_88f8._0_8_ + uVar60) * (uint)bVar39;
                          iVar69 = (uint)stack0xffffffffffff7710[uVar60] * (uint)bVar39;
                          psVar61[-1] = (char)((((uint)*(byte *)(local_88e8._0_8_ + uVar60) *
                                                 (uint)bVar39 + 0x80 >> 8) +
                                                (uint)*(byte *)(local_88e8._0_8_ + uVar60) *
                                                (uint)bVar39 + 0x80 >> 8) * 0x1d +
                                               (iVar69 + (iVar69 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                               (iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8) * 0x4d
                                              >> 8);
                          *psVar61 = 0xff;
                          uVar60 = uVar60 + 1;
                          psVar61 = psVar61 + uVar44;
                          psVar58 = stack0xffffffffffff7710;
                        } while (uVar60 < psVar72->img_x);
                      }
                    }
                  }
                  else {
LAB_0015c123:
                    if (uVar44 == 1) {
                      if (psVar72->img_x != 0) {
                        psVar61 = (stbi_uc *)0x0;
                        do {
                          (psVar50->buffer_start + ((ulong)(sVar41 * iVar71) - 0x38))[(long)psVar61]
                               = *(stbi_uc *)(local_88f8._0_8_ + (long)psVar61);
                          psVar61 = psVar61 + 1;
                          psVar58 = (stbi_uc *)(ulong)psVar72->img_x;
                        } while (psVar61 < (stbi_uc *)(ulong)psVar72->img_x);
                      }
                    }
                    else if (psVar72->img_x != 0) {
                      psVar61 = (stbi_uc *)0x0;
                      do {
                        psVar50->buffer_start[(long)psVar61 * 2 + (ulong)(sVar41 * iVar71) + -0x38]
                             = *(stbi_uc *)(local_88f8._0_8_ + (long)psVar61);
                        psVar50->buffer_start[(long)psVar61 * 2 + (ulong)(sVar41 * iVar71) + -0x37]
                             = 0xff;
                        psVar61 = psVar61 + 1;
                        psVar58 = (stbi_uc *)(ulong)psVar72->img_x;
                      } while (psVar61 < (stbi_uc *)(ulong)psVar72->img_x);
                    }
                  }
                }
                else {
                  psVar72 = local_88d0->s;
                  if (psVar72->img_n == 3) {
                    if (bVar78) {
                      if (psVar72->img_x != 0) {
                        psVar61 = psVar50->buffer_start + ((ulong)(sVar41 * iVar71) - 0x35);
                        psVar58 = (stbi_uc *)0x0;
                        do {
                          psVar61[-3] = *(stbi_uc *)(local_88f8._0_8_ + (long)psVar58);
                          psVar61[-2] = stack0xffffffffffff7710[(long)psVar58];
                          psVar61[-1] = *(stbi_uc *)(local_88e8._0_8_ + (long)psVar58);
                          *psVar61 = 0xff;
                          psVar58 = psVar58 + 1;
                          psVar61 = psVar61 + uVar44;
                        } while (psVar58 < (stbi_uc *)(ulong)psVar72->img_x);
                      }
                    }
                    else {
LAB_0015c196:
                      (*local_88d0->YCbCr_to_RGB_kernel)
                                (psVar50->buffer_start + ((ulong)(uVar63 * uVar44 * sVar41) - 0x38),
                                 (stbi_uc *)local_88f8._0_8_,stack0xffffffffffff7710,
                                 (stbi_uc *)local_88e8._0_8_,psVar72->img_x,uVar44);
                      psVar72 = psVar45->s;
                      psVar58 = extraout_RDX_13;
                    }
                  }
                  else if (psVar72->img_n == 4) {
                    if (local_88d0->app14_color_transform == 2) {
                      (*local_88d0->YCbCr_to_RGB_kernel)
                                (psVar50->buffer_start + ((ulong)(uVar63 * uVar44 * sVar41) - 0x38),
                                 (stbi_uc *)local_88f8._0_8_,stack0xffffffffffff7710,
                                 (stbi_uc *)local_88e8._0_8_,psVar72->img_x,uVar44);
                      psVar72 = psVar45->s;
                      psVar58 = extraout_RDX_14;
                      if (psVar72->img_x != 0) {
                        psVar61 = psVar50->buffer_start + ((ulong)(sVar41 * iVar71) - 0x36);
                        uVar60 = 0;
                        do {
                          bVar39 = *(byte *)(local_88e8._8_8_ + uVar60);
                          iVar40 = (psVar61[-2] ^ 0xff) * (uint)bVar39;
                          psVar61[-2] = (byte)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          iVar40 = (psVar61[-1] ^ 0xff) * (uint)bVar39;
                          psVar61[-1] = (byte)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                          iVar40 = (*psVar61 ^ 0xff) * (uint)bVar39;
                          uVar56 = iVar40 + 0x80U >> 8;
                          *psVar61 = (byte)(iVar40 + uVar56 + 0x80 >> 8);
                          uVar60 = uVar60 + 1;
                          psVar61 = psVar61 + uVar44;
                          psVar58 = (stbi_uc *)(ulong)uVar56;
                        } while (uVar60 < psVar72->img_x);
                      }
                    }
                    else {
                      if (local_88d0->app14_color_transform != 0) goto LAB_0015c196;
                      if (psVar72->img_x != 0) {
                        psVar61 = psVar50->buffer_start + ((ulong)(sVar41 * iVar71) - 0x35);
                        uVar60 = 0;
                        do {
                          bVar39 = *(byte *)(local_88e8._8_8_ + uVar60);
                          iVar40 = (uint)*(byte *)(local_88f8._0_8_ + uVar60) * (uint)bVar39;
                          psVar61[-3] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          iVar40 = (uint)stack0xffffffffffff7710[uVar60] * (uint)bVar39;
                          psVar61[-2] = (char)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                          psVar61[-1] = (char)((uint)*(byte *)(local_88e8._0_8_ + uVar60) *
                                               (uint)bVar39 +
                                               ((uint)*(byte *)(local_88e8._0_8_ + uVar60) *
                                                (uint)bVar39 + 0x80 >> 8) + 0x80 >> 8);
                          *psVar61 = 0xff;
                          uVar60 = uVar60 + 1;
                          psVar61 = psVar61 + uVar44;
                          psVar58 = (stbi_uc *)local_88e8._0_8_;
                        } while (uVar60 < psVar72->img_x);
                      }
                    }
                  }
                  else if (psVar72->img_x != 0) {
                    psVar61 = psVar50->buffer_start + ((ulong)(sVar41 * iVar71) - 0x35);
                    uVar60 = 0;
                    do {
                      sVar38 = *(stbi_uc *)(local_88f8._0_8_ + uVar60);
                      psVar61[-1] = sVar38;
                      psVar61[-2] = sVar38;
                      psVar61[-3] = sVar38;
                      *psVar61 = 0xff;
                      uVar60 = uVar60 + 1;
                      psVar61 = psVar61 + uVar44;
                    } while (uVar60 < psVar72->img_x);
                  }
                }
                iVar40 = (int)psVar58;
                uVar63 = uVar63 + 1;
                iVar71 = iVar71 + uVar44;
              } while (uVar63 < psVar72->img_y);
              uVar63 = psVar72->img_n;
            }
            stbi__free_jpeg_components(psVar45,uVar63,iVar40);
            psVar72 = psVar45->s;
            *x = psVar72->img_x;
            *y = psVar72->img_y;
            if (comp != (int *)0x0) {
              *comp = (uint)(2 < psVar72->img_n) * 2 + 1;
            }
            goto LAB_0015ba0f;
          }
          uVar44 = req_comp + (uint)(req_comp == 0);
          goto LAB_0015bb62;
        }
        iVar40 = stbi__process_marker(psVar45,uVar75);
        paVar57 = extraout_RDX_00;
        if (iVar40 != 0) goto LAB_0015a126;
      }
LAB_0015b9fa:
      stbi__free_jpeg_components(psVar45,psVar45->s->img_n,(int)paVar57);
    }
    else {
      pcVar46 = "Internal error";
LAB_00159fc7:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar46;
    }
    psVar50 = (stbi__context *)0x0;
LAB_0015ba0f:
    free(psVar45);
  }
  else {
    iVar40 = stbi__check_png_header(s);
    psVar61 = s->img_buffer_original;
    s->img_buffer = psVar61;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar40 == 0) {
      if (psVar61 < s->img_buffer_original_end) {
LAB_0015b3c7:
        psVar47 = psVar61 + 1;
        s->img_buffer = psVar47;
        if (*psVar61 != 'B') goto LAB_0015b4e6;
        if (s->img_buffer_end <= psVar47) {
          if (s->read_from_callbacks == 0) goto LAB_0015b4e6;
          stbi__refill_buffer(s);
          psVar47 = s->img_buffer;
        }
        s->img_buffer = psVar47 + 1;
        if (*psVar47 != 'M') goto LAB_0015b4e6;
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar75 = stbi__get16le(s);
        iVar40 = stbi__get16le(s);
        uVar75 = iVar40 << 0x10 | uVar75;
        if (((uVar75 < 0x39) && ((0x100010000001000U >> ((ulong)uVar75 & 0x3f) & 1) != 0)) ||
           (uVar75 == 0x6c)) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
LAB_0015b490:
          local_88e8._12_4_ = 0xff;
          pvVar48 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_88f8);
          if (pvVar48 == (void *)0x0) goto LAB_0015a026;
          local_88b0 = s->img_y;
          uVar75 = -local_88b0;
          if (0 < (int)local_88b0) {
            uVar75 = local_88b0;
          }
          s->img_y = uVar75;
          if ((0x1000000 < uVar75) || (uVar44 = s->img_x, 0x1000000 < uVar44)) {
            pcVar46 = "Very large image (corrupt?)";
            goto LAB_0015a01d;
          }
          z = local_88e8._0_4_;
          z_00 = local_88e8._4_4_;
          z_01 = local_88e8._8_4_;
          if (local_88f8._8_4_ == 0xc) {
            if (0x17 < (int)local_88f8._0_4_) goto LAB_0015ba73;
            uVar63 = ((local_88f8._4_4_ - local_88d8) + -0x18) / 3;
LAB_0015ba48:
            local_8988 = (ulong)uVar63;
            if (uVar63 == 0) goto LAB_0015ba73;
            bVar31 = false;
LAB_0015c3f3:
            bVar78 = local_88e8._8_4_ == 0xff000000;
            iVar40 = 4 - (uint)(local_88e8._8_4_ == 0);
            iVar71 = local_88f8._0_4_;
LAB_0015c416:
            local_88d0 = (stbi__jpeg *)CONCAT44(local_88d0._4_4_,uStack_88ec);
            local_8968 = local_88e8._12_4_;
            s->img_n = iVar40;
            if (2 < req_comp) {
              iVar40 = req_comp;
            }
            iVar69 = stbi__mad3sizes_valid(iVar40,uVar44,uVar75,0);
            if (iVar69 != 0) {
              data_01 = (uchar *)stbi__malloc_mad3(iVar40,uVar44,uVar75,0);
              if (data_01 == (uchar *)0x0) {
                pcVar46 = "Out of memory";
                goto LAB_0015a01d;
              }
              if (iVar71 < 0x10) {
                iVar69 = (int)local_8988;
                if (bVar31 || 0x100 < iVar69) goto LAB_0015c7ef;
                if (0 < iVar69) {
                  psVar61 = s->img_buffer;
                  uVar60 = 0;
                  psVar58 = psVar61;
                  do {
                    psVar47 = s->img_buffer_end;
                    if (psVar61 < psVar47) {
LAB_0015c4cf:
                      psVar58 = psVar61 + 1;
                      s->img_buffer = psVar58;
                      sVar38 = *psVar61;
                      psVar61 = psVar58;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar61 = s->img_buffer;
                        psVar47 = s->img_buffer_end;
                        goto LAB_0015c4cf;
                      }
                      sVar38 = '\0';
                    }
                    local_88a8.pal[uVar60 - 0xd][2] = sVar38;
                    if (psVar61 < psVar47) {
LAB_0015c50e:
                      psVar58 = psVar61 + 1;
                      s->img_buffer = psVar58;
                      sVar38 = *psVar61;
                      psVar61 = psVar58;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar61 = s->img_buffer;
                        psVar47 = s->img_buffer_end;
                        goto LAB_0015c50e;
                      }
                      sVar38 = '\0';
                    }
                    local_88a8.pal[uVar60 - 0xd][1] = sVar38;
                    if (psVar61 < psVar47) {
LAB_0015c546:
                      psVar58 = psVar61 + 1;
                      s->img_buffer = psVar58;
                      sVar38 = *psVar61;
                      psVar61 = psVar58;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar61 = s->img_buffer;
                        goto LAB_0015c546;
                      }
                      sVar38 = '\0';
                    }
                    local_88a8.pal[uVar60 - 0xd][0] = sVar38;
                    if (local_88f8._8_4_ != 0xc) {
                      if (s->img_buffer_end <= psVar58) {
                        psVar61 = psVar58;
                        if (s->read_from_callbacks == 0) goto LAB_0015c591;
                        stbi__refill_buffer(s);
                        psVar58 = s->img_buffer;
                      }
                      psVar61 = psVar58 + 1;
                      s->img_buffer = psVar61;
                      psVar58 = psVar61;
                    }
LAB_0015c591:
                    local_88a8.pal[uVar60 - 0xd][3] = 0xff;
                    uVar60 = uVar60 + 1;
                  } while (local_8988 != uVar60);
                }
                stbi__skip(s,(iVar69 * (local_88f8._8_4_ == 0xc | 0xfffffffc) + local_88f8._4_4_) -
                             (local_88f8._8_4_ + local_88d8));
                if (iVar71 == 1) {
                  sVar41 = s->img_y;
                  if (0 < (int)sVar41) {
                    sVar66 = s->img_x;
                    iVar69 = 0;
                    iVar71 = 0;
                    do {
                      pbVar51 = s->img_buffer;
                      if (pbVar51 < s->img_buffer_end) {
LAB_0015cce8:
                        s->img_buffer = pbVar51 + 1;
                        uVar75 = (uint)*pbVar51;
                        pbVar51 = pbVar51 + 1;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          pbVar51 = s->img_buffer;
                          goto LAB_0015cce8;
                        }
                        uVar75 = 0;
                      }
                      sVar41 = s->img_x;
                      if (0 < (int)sVar41) {
                        sVar70 = 0;
                        uVar44 = 7;
                        do {
                          uVar60 = (ulong)((uVar75 >> (uVar44 & 0x1f) & 1) != 0);
                          data_01[iVar69] = local_88a8.pal[uVar60 - 0xd][0];
                          data_01[(long)iVar69 + 1] = local_88a8.pal[uVar60 - 0xd][1];
                          data_01[(long)iVar69 + 2] = local_88a8.pal[uVar60 - 0xd][2];
                          iVar42 = iVar69 + 3;
                          if (iVar40 == 4) {
                            data_01[(long)iVar69 + 3] = 0xff;
                            iVar42 = iVar69 + 4;
                          }
                          iVar69 = iVar42;
                          sVar70 = sVar70 + 1;
                          if (sVar70 == sVar41) break;
                          if ((int)uVar44 < 1) {
                            if (s->img_buffer_end <= pbVar51) {
                              if (s->read_from_callbacks == 0) {
                                uVar75 = 0;
                                uVar44 = 7;
                                goto LAB_0015cda9;
                              }
                              stbi__refill_buffer(s);
                              pbVar51 = s->img_buffer;
                              sVar41 = s->img_x;
                            }
                            s->img_buffer = pbVar51 + 1;
                            uVar75 = (uint)*pbVar51;
                            uVar44 = 7;
                            pbVar51 = pbVar51 + 1;
                          }
                          else {
                            uVar44 = uVar44 - 1;
                          }
LAB_0015cda9:
                        } while ((int)sVar70 < (int)sVar41);
                      }
                      stbi__skip(s,-(sVar66 + 7 >> 3) & 3);
                      iVar71 = iVar71 + 1;
                      sVar41 = s->img_y;
                    } while (iVar71 < (int)sVar41);
                  }
                }
                else {
                  if (iVar71 == 8) {
                    uVar75 = s->img_x;
                  }
                  else {
                    if (iVar71 != 4) goto LAB_0015c7ef;
                    uVar75 = s->img_x + 1 >> 1;
                  }
                  sVar41 = s->img_y;
                  if (0 < (int)sVar41) {
                    local_8928 = -uVar75 & 3;
                    uVar60 = 0;
                    iVar69 = 0;
                    do {
                      if (0 < (int)s->img_x) {
                        pbVar51 = s->img_buffer;
                        iVar42 = 0;
                        do {
                          if (pbVar51 < s->img_buffer_end) {
LAB_0015cb4e:
                            s->img_buffer = pbVar51 + 1;
                            uVar75 = (uint)*pbVar51;
                            pbVar51 = pbVar51 + 1;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              stbi__refill_buffer(s);
                              pbVar51 = s->img_buffer;
                              goto LAB_0015cb4e;
                            }
                            uVar75 = 0;
                          }
                          uVar63 = uVar75 & 0xf;
                          uVar44 = uVar75 >> 4;
                          if (iVar71 != 4) {
                            uVar44 = uVar75;
                          }
                          uVar68 = (ulong)uVar44;
                          if (iVar71 != 4) {
                            uVar63 = 0;
                          }
                          lVar54 = (long)(int)uVar60;
                          uVar64 = lVar54 + 3;
                          data_01[lVar54] = local_88a8.pal[uVar68 - 0xd][0];
                          data_01[lVar54 + 1] = local_88a8.pal[uVar68 - 0xd][1];
                          data_01[lVar54 + 2] = local_88a8.pal[uVar68 - 0xd][2];
                          if (iVar40 == 4) {
                            data_01[lVar54 + 3] = 0xff;
                            uVar64 = (ulong)((int)uVar60 + 4);
                          }
                          if (iVar42 + 1U == s->img_x) {
                            uVar60 = uVar64 & 0xffffffff;
                            break;
                          }
                          if (iVar71 == 8) {
                            if (s->img_buffer_end <= pbVar51) {
                              if (s->read_from_callbacks == 0) {
                                uVar63 = 0;
                                goto LAB_0015cc12;
                              }
                              stbi__refill_buffer(s);
                              pbVar51 = s->img_buffer;
                            }
                            s->img_buffer = pbVar51 + 1;
                            uVar63 = (uint)*pbVar51;
                            pbVar51 = pbVar51 + 1;
                          }
LAB_0015cc12:
                          lVar54 = (long)(int)uVar64;
                          uVar60 = lVar54 + 3;
                          uVar68 = (ulong)uVar63;
                          data_01[lVar54] = local_88a8.pal[uVar68 - 0xd][0];
                          data_01[lVar54 + 1] = local_88a8.pal[uVar68 - 0xd][1];
                          data_01[lVar54 + 2] = local_88a8.pal[uVar68 - 0xd][2];
                          if (iVar40 == 4) {
                            data_01[lVar54 + 3] = 0xff;
                            uVar60 = (ulong)((int)uVar64 + 4);
                          }
                          iVar42 = iVar42 + 2;
                        } while (iVar42 < (int)s->img_x);
                      }
                      stbi__skip(s,local_8928);
                      iVar69 = iVar69 + 1;
                      sVar41 = s->img_y;
                    } while (iVar69 < (int)sVar41);
                  }
                }
              }
              else {
                stbi__skip(s,local_88f8._4_4_ - (local_88f8._8_4_ + local_88d8));
                uVar75 = (uint)local_88d0;
                if (iVar71 == 0x10) {
                  local_88fc = s->img_x * 2 & 2;
LAB_0015c735:
                  if ((z != 0 && (uint)local_88d0 != 0) && z_00 != 0) {
                    iVar62 = stbi__high_bit((uint)local_88d0);
                    uVar75 = stbi__bitcount(uVar75);
                    iVar69 = stbi__high_bit(z);
                    local_8944 = stbi__bitcount(z);
                    iVar42 = stbi__high_bit(z_00);
                    uVar44 = stbi__bitcount(z_00);
                    iVar59 = stbi__high_bit(z_01);
                    local_88b8 = CONCAT44(local_88b8._4_4_,iVar59);
                    local_891c = stbi__bitcount(z_01);
                    local_88c0 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_88c0._4_4_,uVar44);
                    if ((uVar44 < 9 && (local_8944 < 9 && uVar75 < 9)) && local_891c < 9) {
                      iVar62 = iVar62 + -7;
                      iVar69 = iVar69 + -7;
                      iVar42 = iVar42 + -7;
                      iVar59 = (int)local_88b8 + -7;
                      local_88c4 = (undefined4)CONCAT71((uint7)(uint3)(local_891c >> 8),1);
                      bVar78 = false;
                      goto LAB_0015c838;
                    }
                  }
LAB_0015c7ef:
                  free(data_01);
                  goto LAB_0015c7f7;
                }
                if (iVar71 == 0x20) {
                  local_88fc = 0;
                  if (!(bool)(((uint)local_88d0 == 0xff0000 && (z == 0xff00 && z_00 == 0xff)) &
                             bVar78)) goto LAB_0015c735;
                  bVar78 = true;
                }
                else {
                  local_88fc = 0;
                  if (iVar71 != 0x18) goto LAB_0015c735;
                  local_88fc = s->img_x & 3;
                  bVar78 = false;
                }
                local_88c4 = 0;
                iVar62 = 0;
                iVar69 = 0;
                iVar42 = 0;
                iVar59 = 0;
                uVar75 = 0;
                local_8944 = 0;
                local_88c0 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88c0 & 0xffffffff00000000);
                local_891c = 0;
LAB_0015c838:
                local_88b8 = CONCAT44(local_88b8._4_4_,iVar59);
                sVar41 = s->img_y;
                if (0 < (int)sVar41) {
                  uVar60 = 0;
                  iVar59 = 0;
                  do {
                    uVar68 = uVar60;
                    local_88ac = iVar59;
                    if ((char)local_88c4 == '\0') {
                      if (0 < (int)s->img_x) {
                        pbVar51 = s->img_buffer;
                        iVar59 = 0;
                        do {
                          pbVar55 = s->img_buffer_end;
                          if (pbVar51 < pbVar55) {
LAB_0015c996:
                            s->img_buffer = pbVar51 + 1;
                            bVar39 = *pbVar51;
                            pbVar51 = pbVar51 + 1;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              stbi__refill_buffer(s);
                              pbVar51 = s->img_buffer;
                              pbVar55 = s->img_buffer_end;
                              goto LAB_0015c996;
                            }
                            bVar39 = 0;
                          }
                          lVar54 = (long)(int)uVar60;
                          data_01[lVar54 + 2] = bVar39;
                          if (pbVar51 < pbVar55) {
LAB_0015c9d9:
                            s->img_buffer = pbVar51 + 1;
                            bVar39 = *pbVar51;
                            pbVar51 = pbVar51 + 1;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              stbi__refill_buffer(s);
                              pbVar51 = s->img_buffer;
                              pbVar55 = s->img_buffer_end;
                              goto LAB_0015c9d9;
                            }
                            bVar39 = 0;
                          }
                          data_01[lVar54 + 1] = bVar39;
                          if (pbVar51 < pbVar55) {
LAB_0015ca12:
                            s->img_buffer = pbVar51 + 1;
                            bVar39 = *pbVar51;
                            pbVar51 = pbVar51 + 1;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              stbi__refill_buffer(s);
                              pbVar51 = s->img_buffer;
                              goto LAB_0015ca12;
                            }
                            bVar39 = 0;
                          }
                          data_01[lVar54] = bVar39;
                          bVar39 = 0xff;
                          if (bVar78) {
                            if (s->img_buffer_end <= pbVar51) {
                              if (s->read_from_callbacks == 0) {
                                bVar39 = 0;
                                goto LAB_0015ca64;
                              }
                              stbi__refill_buffer(s);
                              pbVar51 = s->img_buffer;
                            }
                            s->img_buffer = pbVar51 + 1;
                            bVar39 = *pbVar51;
                            pbVar51 = pbVar51 + 1;
                          }
LAB_0015ca64:
                          uVar68 = lVar54 + 3;
                          if (iVar40 == 4) {
                            data_01[lVar54 + 3] = bVar39;
                            uVar68 = (ulong)((int)uVar60 + 4);
                          }
                          local_8968 = local_8968 | bVar39;
                          iVar59 = iVar59 + 1;
                          uVar60 = uVar68 & 0xffffffff;
                        } while (iVar59 < (int)s->img_x);
                      }
                    }
                    else if (0 < (int)s->img_x) {
                      iVar59 = 0;
                      do {
                        uVar44 = stbi__get16le(s);
                        if (iVar71 != 0x10) {
                          iVar43 = stbi__get16le(s);
                          uVar44 = uVar44 | iVar43 << 0x10;
                        }
                        iVar43 = stbi__shiftsigned(uVar44 & (uint)local_88d0,iVar62,uVar75);
                        lVar54 = (long)(int)uVar60;
                        data_01[lVar54] = (uchar)iVar43;
                        iVar43 = stbi__shiftsigned(uVar44 & z,iVar69,local_8944);
                        data_01[lVar54 + 1] = (uchar)iVar43;
                        iVar43 = stbi__shiftsigned(uVar44 & z_00,iVar42,(int)local_88c0);
                        data_01[lVar54 + 2] = (uchar)iVar43;
                        if (z_01 == 0) {
                          uVar44 = 0xff;
                        }
                        else {
                          uVar44 = stbi__shiftsigned(uVar44 & z_01,(int)local_88b8,local_891c);
                        }
                        uVar68 = lVar54 + 3;
                        if (iVar40 == 4) {
                          data_01[lVar54 + 3] = (uchar)uVar44;
                          uVar68 = (ulong)((int)uVar60 + 4);
                        }
                        local_8968 = local_8968 | uVar44;
                        iVar59 = iVar59 + 1;
                        uVar60 = uVar68 & 0xffffffff;
                      } while (iVar59 < (int)s->img_x);
                    }
                    stbi__skip(s,local_88fc);
                    iVar59 = local_88ac + 1;
                    sVar41 = s->img_y;
                    uVar60 = uVar68 & 0xffffffff;
                  } while (iVar59 < (int)sVar41);
                }
              }
              auVar37 = _DAT_00178a90;
              auVar36 = _DAT_00178a80;
              auVar35 = _DAT_00178a70;
              auVar34 = _DAT_00178a60;
              auVar33 = _DAT_00178a50;
              auVar32 = _DAT_00178a40;
              auVar117 = _DAT_0016f050;
              if (((iVar40 == 4) && (local_8968 == 0)) &&
                 (uVar75 = s->img_x * sVar41 * 4 - 1, -1 < (int)uVar75)) {
                uVar44 = uVar75 >> 2;
                auVar79._4_4_ = 0;
                auVar79._0_4_ = uVar44;
                auVar79._8_4_ = uVar44;
                auVar79._12_4_ = 0;
                puVar52 = data_01 + uVar75;
                uVar60 = 0;
                do {
                  auVar97._8_4_ = (int)uVar60;
                  auVar97._0_8_ = uVar60;
                  auVar97._12_4_ = (int)(uVar60 >> 0x20);
                  auVar99 = auVar79 | auVar117;
                  auVar101 = (auVar97 | auVar37) ^ auVar117;
                  iVar71 = auVar99._0_4_;
                  iVar62 = -(uint)(iVar71 < auVar101._0_4_);
                  iVar69 = auVar99._4_4_;
                  auVar103._4_4_ = -(uint)(iVar69 < auVar101._4_4_);
                  iVar42 = auVar99._8_4_;
                  iVar43 = -(uint)(iVar42 < auVar101._8_4_);
                  iVar59 = auVar99._12_4_;
                  auVar103._12_4_ = -(uint)(iVar59 < auVar101._12_4_);
                  auVar80._4_4_ = iVar62;
                  auVar80._0_4_ = iVar62;
                  auVar80._8_4_ = iVar43;
                  auVar80._12_4_ = iVar43;
                  auVar80 = pshuflw(in_XMM1,auVar80,0xe8);
                  auVar102._4_4_ = -(uint)(auVar101._4_4_ == iVar69);
                  auVar102._12_4_ = -(uint)(auVar101._12_4_ == iVar59);
                  auVar102._0_4_ = auVar102._4_4_;
                  auVar102._8_4_ = auVar102._12_4_;
                  auVar89 = pshuflw(in_XMM2,auVar102,0xe8);
                  auVar103._0_4_ = auVar103._4_4_;
                  auVar103._8_4_ = auVar103._12_4_;
                  auVar101 = pshuflw(auVar80,auVar103,0xe8);
                  auVar99._8_4_ = 0xffffffff;
                  auVar99._0_8_ = 0xffffffffffffffff;
                  auVar99._12_4_ = 0xffffffff;
                  auVar99 = (auVar101 | auVar89 & auVar80) ^ auVar99;
                  auVar99 = packssdw(auVar99,auVar99);
                  if ((auVar99 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *puVar52 = 0xff;
                  }
                  auVar89._4_4_ = iVar62;
                  auVar89._0_4_ = iVar62;
                  auVar89._8_4_ = iVar43;
                  auVar89._12_4_ = iVar43;
                  auVar103 = auVar102 & auVar89 | auVar103;
                  auVar99 = packssdw(auVar103,auVar103);
                  auVar101._8_4_ = 0xffffffff;
                  auVar101._0_8_ = 0xffffffffffffffff;
                  auVar101._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 ^ auVar101,auVar99 ^ auVar101);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._0_4_ >> 8 & 1) != 0) {
                    puVar52[-4] = 0xff;
                  }
                  auVar99 = (auVar97 | auVar36) ^ auVar117;
                  auVar90._0_4_ = -(uint)(iVar71 < auVar99._0_4_);
                  auVar90._4_4_ = -(uint)(iVar69 < auVar99._4_4_);
                  auVar90._8_4_ = -(uint)(iVar42 < auVar99._8_4_);
                  auVar90._12_4_ = -(uint)(iVar59 < auVar99._12_4_);
                  auVar104._4_4_ = auVar90._0_4_;
                  auVar104._0_4_ = auVar90._0_4_;
                  auVar104._8_4_ = auVar90._8_4_;
                  auVar104._12_4_ = auVar90._8_4_;
                  iVar62 = -(uint)(auVar99._4_4_ == iVar69);
                  iVar43 = -(uint)(auVar99._12_4_ == iVar59);
                  auVar17._4_4_ = iVar62;
                  auVar17._0_4_ = iVar62;
                  auVar17._8_4_ = iVar43;
                  auVar17._12_4_ = iVar43;
                  auVar114._4_4_ = auVar90._4_4_;
                  auVar114._0_4_ = auVar90._4_4_;
                  auVar114._8_4_ = auVar90._12_4_;
                  auVar114._12_4_ = auVar90._12_4_;
                  auVar99 = auVar17 & auVar104 | auVar114;
                  auVar99 = packssdw(auVar99,auVar99);
                  auVar8._8_4_ = 0xffffffff;
                  auVar8._0_8_ = 0xffffffffffffffff;
                  auVar8._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 ^ auVar8,auVar99 ^ auVar8);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._0_4_ >> 0x10 & 1) != 0) {
                    puVar52[-8] = 0xff;
                  }
                  auVar99 = pshufhw(auVar99,auVar104,0x84);
                  auVar18._4_4_ = iVar62;
                  auVar18._0_4_ = iVar62;
                  auVar18._8_4_ = iVar43;
                  auVar18._12_4_ = iVar43;
                  auVar101 = pshufhw(auVar90,auVar18,0x84);
                  auVar80 = pshufhw(auVar99,auVar114,0x84);
                  auVar81._8_4_ = 0xffffffff;
                  auVar81._0_8_ = 0xffffffffffffffff;
                  auVar81._12_4_ = 0xffffffff;
                  auVar81 = (auVar80 | auVar101 & auVar99) ^ auVar81;
                  auVar99 = packssdw(auVar81,auVar81);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._0_4_ >> 0x18 & 1) != 0) {
                    puVar52[-0xc] = 0xff;
                  }
                  auVar99 = (auVar97 | auVar35) ^ auVar117;
                  auVar91._0_4_ = -(uint)(iVar71 < auVar99._0_4_);
                  auVar91._4_4_ = -(uint)(iVar69 < auVar99._4_4_);
                  auVar91._8_4_ = -(uint)(iVar42 < auVar99._8_4_);
                  auVar91._12_4_ = -(uint)(iVar59 < auVar99._12_4_);
                  auVar19._4_4_ = auVar91._0_4_;
                  auVar19._0_4_ = auVar91._0_4_;
                  auVar19._8_4_ = auVar91._8_4_;
                  auVar19._12_4_ = auVar91._8_4_;
                  auVar101 = pshuflw(auVar114,auVar19,0xe8);
                  auVar82._0_4_ = -(uint)(auVar99._0_4_ == iVar71);
                  auVar82._4_4_ = -(uint)(auVar99._4_4_ == iVar69);
                  auVar82._8_4_ = -(uint)(auVar99._8_4_ == iVar42);
                  auVar82._12_4_ = -(uint)(auVar99._12_4_ == iVar59);
                  auVar105._4_4_ = auVar82._4_4_;
                  auVar105._0_4_ = auVar82._4_4_;
                  auVar105._8_4_ = auVar82._12_4_;
                  auVar105._12_4_ = auVar82._12_4_;
                  auVar99 = pshuflw(auVar82,auVar105,0xe8);
                  auVar106._4_4_ = auVar91._4_4_;
                  auVar106._0_4_ = auVar91._4_4_;
                  auVar106._8_4_ = auVar91._12_4_;
                  auVar106._12_4_ = auVar91._12_4_;
                  auVar80 = pshuflw(auVar91,auVar106,0xe8);
                  auVar9._8_4_ = 0xffffffff;
                  auVar9._0_8_ = 0xffffffffffffffff;
                  auVar9._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 & auVar101,(auVar80 | auVar99 & auVar101) ^ auVar9);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    puVar52[-0x10] = 0xff;
                  }
                  auVar20._4_4_ = auVar91._0_4_;
                  auVar20._0_4_ = auVar91._0_4_;
                  auVar20._8_4_ = auVar91._8_4_;
                  auVar20._12_4_ = auVar91._8_4_;
                  auVar106 = auVar105 & auVar20 | auVar106;
                  auVar80 = packssdw(auVar106,auVar106);
                  auVar10._8_4_ = 0xffffffff;
                  auVar10._0_8_ = 0xffffffffffffffff;
                  auVar10._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99,auVar80 ^ auVar10);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._4_2_ >> 8 & 1) != 0) {
                    puVar52[-0x14] = 0xff;
                  }
                  auVar99 = (auVar97 | auVar34) ^ auVar117;
                  auVar92._0_4_ = -(uint)(iVar71 < auVar99._0_4_);
                  auVar92._4_4_ = -(uint)(iVar69 < auVar99._4_4_);
                  auVar92._8_4_ = -(uint)(iVar42 < auVar99._8_4_);
                  auVar92._12_4_ = -(uint)(iVar59 < auVar99._12_4_);
                  auVar107._4_4_ = auVar92._0_4_;
                  auVar107._0_4_ = auVar92._0_4_;
                  auVar107._8_4_ = auVar92._8_4_;
                  auVar107._12_4_ = auVar92._8_4_;
                  iVar62 = -(uint)(auVar99._4_4_ == iVar69);
                  iVar43 = -(uint)(auVar99._12_4_ == iVar59);
                  auVar21._4_4_ = iVar62;
                  auVar21._0_4_ = iVar62;
                  auVar21._8_4_ = iVar43;
                  auVar21._12_4_ = iVar43;
                  auVar115._4_4_ = auVar92._4_4_;
                  auVar115._0_4_ = auVar92._4_4_;
                  auVar115._8_4_ = auVar92._12_4_;
                  auVar115._12_4_ = auVar92._12_4_;
                  auVar99 = auVar21 & auVar107 | auVar115;
                  auVar99 = packssdw(auVar99,auVar99);
                  auVar11._8_4_ = 0xffffffff;
                  auVar11._0_8_ = 0xffffffffffffffff;
                  auVar11._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 ^ auVar11,auVar99 ^ auVar11);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    puVar52[-0x18] = 0xff;
                  }
                  auVar99 = pshufhw(auVar99,auVar107,0x84);
                  auVar22._4_4_ = iVar62;
                  auVar22._0_4_ = iVar62;
                  auVar22._8_4_ = iVar43;
                  auVar22._12_4_ = iVar43;
                  auVar101 = pshufhw(auVar92,auVar22,0x84);
                  auVar80 = pshufhw(auVar99,auVar115,0x84);
                  auVar83._8_4_ = 0xffffffff;
                  auVar83._0_8_ = 0xffffffffffffffff;
                  auVar83._12_4_ = 0xffffffff;
                  auVar83 = (auVar80 | auVar101 & auVar99) ^ auVar83;
                  auVar99 = packssdw(auVar83,auVar83);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._6_2_ >> 8 & 1) != 0) {
                    puVar52[-0x1c] = 0xff;
                  }
                  auVar99 = (auVar97 | auVar33) ^ auVar117;
                  auVar93._0_4_ = -(uint)(iVar71 < auVar99._0_4_);
                  auVar93._4_4_ = -(uint)(iVar69 < auVar99._4_4_);
                  auVar93._8_4_ = -(uint)(iVar42 < auVar99._8_4_);
                  auVar93._12_4_ = -(uint)(iVar59 < auVar99._12_4_);
                  auVar23._4_4_ = auVar93._0_4_;
                  auVar23._0_4_ = auVar93._0_4_;
                  auVar23._8_4_ = auVar93._8_4_;
                  auVar23._12_4_ = auVar93._8_4_;
                  auVar101 = pshuflw(auVar115,auVar23,0xe8);
                  auVar84._0_4_ = -(uint)(auVar99._0_4_ == iVar71);
                  auVar84._4_4_ = -(uint)(auVar99._4_4_ == iVar69);
                  auVar84._8_4_ = -(uint)(auVar99._8_4_ == iVar42);
                  auVar84._12_4_ = -(uint)(auVar99._12_4_ == iVar59);
                  auVar108._4_4_ = auVar84._4_4_;
                  auVar108._0_4_ = auVar84._4_4_;
                  auVar108._8_4_ = auVar84._12_4_;
                  auVar108._12_4_ = auVar84._12_4_;
                  auVar99 = pshuflw(auVar84,auVar108,0xe8);
                  auVar109._4_4_ = auVar93._4_4_;
                  auVar109._0_4_ = auVar93._4_4_;
                  auVar109._8_4_ = auVar93._12_4_;
                  auVar109._12_4_ = auVar93._12_4_;
                  auVar80 = pshuflw(auVar93,auVar109,0xe8);
                  auVar94._8_4_ = 0xffffffff;
                  auVar94._0_8_ = 0xffffffffffffffff;
                  auVar94._12_4_ = 0xffffffff;
                  auVar94 = (auVar80 | auVar99 & auVar101) ^ auVar94;
                  auVar80 = packssdw(auVar94,auVar94);
                  auVar99 = packsswb(auVar99 & auVar101,auVar80);
                  if ((auVar99 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    puVar52[-0x20] = 0xff;
                  }
                  auVar24._4_4_ = auVar93._0_4_;
                  auVar24._0_4_ = auVar93._0_4_;
                  auVar24._8_4_ = auVar93._8_4_;
                  auVar24._12_4_ = auVar93._8_4_;
                  auVar109 = auVar108 & auVar24 | auVar109;
                  auVar80 = packssdw(auVar109,auVar109);
                  auVar12._8_4_ = 0xffffffff;
                  auVar12._0_8_ = 0xffffffffffffffff;
                  auVar12._12_4_ = 0xffffffff;
                  auVar80 = packssdw(auVar80 ^ auVar12,auVar80 ^ auVar12);
                  auVar99 = packsswb(auVar99,auVar80);
                  if ((auVar99._8_2_ >> 8 & 1) != 0) {
                    puVar52[-0x24] = 0xff;
                  }
                  auVar99 = (auVar97 | auVar32) ^ auVar117;
                  auVar95._0_4_ = -(uint)(iVar71 < auVar99._0_4_);
                  auVar95._4_4_ = -(uint)(iVar69 < auVar99._4_4_);
                  auVar95._8_4_ = -(uint)(iVar42 < auVar99._8_4_);
                  auVar95._12_4_ = -(uint)(iVar59 < auVar99._12_4_);
                  auVar110._4_4_ = auVar95._0_4_;
                  auVar110._0_4_ = auVar95._0_4_;
                  auVar110._8_4_ = auVar95._8_4_;
                  auVar110._12_4_ = auVar95._8_4_;
                  iVar62 = -(uint)(auVar99._4_4_ == iVar69);
                  iVar43 = -(uint)(auVar99._12_4_ == iVar59);
                  auVar25._4_4_ = iVar62;
                  auVar25._0_4_ = iVar62;
                  auVar25._8_4_ = iVar43;
                  auVar25._12_4_ = iVar43;
                  auVar116._4_4_ = auVar95._4_4_;
                  auVar116._0_4_ = auVar95._4_4_;
                  auVar116._8_4_ = auVar95._12_4_;
                  auVar116._12_4_ = auVar95._12_4_;
                  auVar99 = auVar25 & auVar110 | auVar116;
                  auVar99 = packssdw(auVar99,auVar99);
                  auVar13._8_4_ = 0xffffffff;
                  auVar13._0_8_ = 0xffffffffffffffff;
                  auVar13._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 ^ auVar13,auVar99 ^ auVar13);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    puVar52[-0x28] = 0xff;
                  }
                  auVar99 = pshufhw(auVar99,auVar110,0x84);
                  auVar26._4_4_ = iVar62;
                  auVar26._0_4_ = iVar62;
                  auVar26._8_4_ = iVar43;
                  auVar26._12_4_ = iVar43;
                  auVar101 = pshufhw(auVar95,auVar26,0x84);
                  auVar80 = pshufhw(auVar99,auVar116,0x84);
                  auVar85._8_4_ = 0xffffffff;
                  auVar85._0_8_ = 0xffffffffffffffff;
                  auVar85._12_4_ = 0xffffffff;
                  auVar85 = (auVar80 | auVar101 & auVar99) ^ auVar85;
                  auVar99 = packssdw(auVar85,auVar85);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._10_2_ >> 8 & 1) != 0) {
                    puVar52[-0x2c] = 0xff;
                  }
                  auVar99 = (auVar97 | _DAT_00178a30) ^ auVar117;
                  auVar96._0_4_ = -(uint)(iVar71 < auVar99._0_4_);
                  auVar96._4_4_ = -(uint)(iVar69 < auVar99._4_4_);
                  auVar96._8_4_ = -(uint)(iVar42 < auVar99._8_4_);
                  auVar96._12_4_ = -(uint)(iVar59 < auVar99._12_4_);
                  auVar27._4_4_ = auVar96._0_4_;
                  auVar27._0_4_ = auVar96._0_4_;
                  auVar27._8_4_ = auVar96._8_4_;
                  auVar27._12_4_ = auVar96._8_4_;
                  auVar101 = pshuflw(auVar116,auVar27,0xe8);
                  auVar86._0_4_ = -(uint)(auVar99._0_4_ == iVar71);
                  auVar86._4_4_ = -(uint)(auVar99._4_4_ == iVar69);
                  auVar86._8_4_ = -(uint)(auVar99._8_4_ == iVar42);
                  auVar86._12_4_ = -(uint)(auVar99._12_4_ == iVar59);
                  auVar111._4_4_ = auVar86._4_4_;
                  auVar111._0_4_ = auVar86._4_4_;
                  auVar111._8_4_ = auVar86._12_4_;
                  auVar111._12_4_ = auVar86._12_4_;
                  auVar99 = pshuflw(auVar86,auVar111,0xe8);
                  auVar112._4_4_ = auVar96._4_4_;
                  auVar112._0_4_ = auVar96._4_4_;
                  auVar112._8_4_ = auVar96._12_4_;
                  auVar112._12_4_ = auVar96._12_4_;
                  auVar80 = pshuflw(auVar96,auVar112,0xe8);
                  auVar14._8_4_ = 0xffffffff;
                  auVar14._0_8_ = 0xffffffffffffffff;
                  auVar14._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 & auVar101,(auVar80 | auVar99 & auVar101) ^ auVar14);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    puVar52[-0x30] = 0xff;
                  }
                  auVar28._4_4_ = auVar96._0_4_;
                  auVar28._0_4_ = auVar96._0_4_;
                  auVar28._8_4_ = auVar96._8_4_;
                  auVar28._12_4_ = auVar96._8_4_;
                  auVar112 = auVar111 & auVar28 | auVar112;
                  auVar80 = packssdw(auVar112,auVar112);
                  auVar15._8_4_ = 0xffffffff;
                  auVar15._0_8_ = 0xffffffffffffffff;
                  auVar15._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99,auVar80 ^ auVar15);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99._12_2_ >> 8 & 1) != 0) {
                    puVar52[-0x34] = 0xff;
                  }
                  auVar99 = (auVar97 | _DAT_00178a20) ^ auVar117;
                  auVar87._0_4_ = -(uint)(iVar71 < auVar99._0_4_);
                  auVar87._4_4_ = -(uint)(iVar69 < auVar99._4_4_);
                  auVar87._8_4_ = -(uint)(iVar42 < auVar99._8_4_);
                  auVar87._12_4_ = -(uint)(iVar59 < auVar99._12_4_);
                  auVar113._4_4_ = auVar87._0_4_;
                  auVar113._0_4_ = auVar87._0_4_;
                  auVar113._8_4_ = auVar87._8_4_;
                  auVar113._12_4_ = auVar87._8_4_;
                  auVar98._4_4_ = -(uint)(auVar99._4_4_ == iVar69);
                  auVar98._12_4_ = -(uint)(auVar99._12_4_ == iVar59);
                  auVar98._0_4_ = auVar98._4_4_;
                  auVar98._8_4_ = auVar98._12_4_;
                  auVar100._4_4_ = auVar87._4_4_;
                  auVar100._0_4_ = auVar87._4_4_;
                  auVar100._8_4_ = auVar87._12_4_;
                  auVar100._12_4_ = auVar87._12_4_;
                  auVar80 = auVar98 & auVar113 | auVar100;
                  auVar99 = packssdw(auVar87,auVar80);
                  auVar16._8_4_ = 0xffffffff;
                  auVar16._0_8_ = 0xffffffffffffffff;
                  auVar16._12_4_ = 0xffffffff;
                  auVar99 = packssdw(auVar99 ^ auVar16,auVar99 ^ auVar16);
                  auVar99 = packsswb(auVar99,auVar99);
                  if ((auVar99 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    puVar52[-0x38] = 0xff;
                  }
                  auVar99 = pshufhw(auVar99,auVar113,0x84);
                  in_XMM2 = pshufhw(auVar80,auVar98,0x84);
                  in_XMM2 = in_XMM2 & auVar99;
                  auVar99 = pshufhw(auVar99,auVar100,0x84);
                  auVar88._8_4_ = 0xffffffff;
                  auVar88._0_8_ = 0xffffffffffffffff;
                  auVar88._12_4_ = 0xffffffff;
                  auVar88 = (auVar99 | in_XMM2) ^ auVar88;
                  auVar99 = packssdw(auVar88,auVar88);
                  in_XMM1 = packsswb(auVar99,auVar99);
                  if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                    puVar52[-0x3c] = 0xff;
                  }
                  uVar60 = uVar60 + 0x10;
                  puVar52 = puVar52 + -0x40;
                } while ((uVar44 + 0x10 & 0x3ffffff0) != uVar60);
              }
              if ((int)local_88b0 < 1) {
                uVar75 = s->img_x;
              }
              else {
                uVar75 = s->img_x;
                if (0 < (int)sVar41 >> 1) {
                  uVar44 = uVar75 * iVar40;
                  uVar63 = (sVar41 - 1) * uVar44;
                  uVar60 = 0;
                  uVar68 = 0;
                  do {
                    if (0 < (int)uVar44) {
                      uVar64 = 0;
                      do {
                        uVar3 = data_01[uVar64 + uVar60];
                        data_01[uVar64 + uVar60] = data_01[uVar64 + uVar63];
                        data_01[uVar64 + uVar63] = uVar3;
                        uVar64 = uVar64 + 1;
                      } while (uVar44 != uVar64);
                    }
                    uVar68 = uVar68 + 1;
                    uVar63 = uVar63 - uVar44;
                    uVar60 = (ulong)((int)uVar60 + uVar44);
                  } while (uVar68 != (uint)((int)sVar41 >> 1));
                }
              }
              if ((req_comp == 0) || (iVar40 == req_comp)) {
LAB_0015d3d3:
                *x = uVar75;
                *y = s->img_y;
                if (comp == (int *)0x0) {
                  return data_01;
                }
                *comp = s->img_n;
                return data_01;
              }
              data_01 = stbi__convert_format(data_01,iVar40,req_comp,uVar75,sVar41);
              if (data_01 != (uchar *)0x0) {
                uVar75 = s->img_x;
                goto LAB_0015d3d3;
              }
              goto LAB_0015a026;
            }
          }
          else {
            if ((int)local_88f8._0_4_ < 0x10) {
              uVar63 = local_88f8._4_4_ - (local_88d8 + local_88f8._8_4_) >> 2;
              goto LAB_0015ba48;
            }
LAB_0015ba73:
            if (local_88f8._4_4_ !=
                ((int)s->img_buffer - *(int *)&s->img_buffer_original) + s->callback_already_read) {
              __assert_fail("info.offset == s->callback_already_read + (int) (s->img_buffer - s->img_buffer_original)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                            ,0x1515,
                            "void *stbi__bmp_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                           );
            }
            if (s->img_buffer + ((long)s->callback_already_read - (long)s) + -0x38 ==
                (stbi_uc *)(long)(int)local_88f8._4_4_) {
              local_8988 = 0;
              bVar78 = true;
              bVar31 = true;
              if (local_88f8._0_4_ != 0x18 || local_88e8._8_4_ != 0xff000000) goto LAB_0015c3f3;
              iVar40 = 3;
              iVar71 = 0x18;
              bVar31 = true;
              goto LAB_0015c416;
            }
          }
LAB_0015c7f7:
          pcVar46 = "Corrupt BMP";
          goto LAB_0015a01d;
        }
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if (uVar75 == 0x7c) goto LAB_0015b490;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          psVar61 = s->img_buffer;
          goto LAB_0015b3c7;
        }
LAB_0015b4e6:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
      }
      iVar40 = stbi__gif_test(s);
      if (iVar40 != 0) {
        memset(&local_88a8,0,0x8870);
        psVar50 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar58);
        if (psVar50 == (stbi__context *)0x0 || psVar50 == s) {
          if ((stbi__jpeg *)local_88a8.out != (stbi__jpeg *)0x0) {
            free(local_88a8.out);
          }
          psVar50 = (stbi__context *)0x0;
        }
        else {
          *x = local_88a8.w;
          *y = local_88a8.h;
          if ((req_comp & 0xfffffffbU) != 0) {
            psVar50 = (stbi__context *)
                      stbi__convert_format((uchar *)psVar50,4,req_comp,local_88a8.w,local_88a8.h);
          }
        }
        free(local_88a8.history);
        psVar45 = (stbi__jpeg *)local_88a8.background;
        goto LAB_0015ba0f;
      }
      iVar40 = stbi__psd_test(s);
      if (iVar40 != 0) {
        pvVar48 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
        return pvVar48;
      }
      iVar40 = stbi__pic_test(s);
      if (iVar40 != 0) {
        pvVar48 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar48;
      }
      iVar40 = stbi__pnm_test(s);
      if (iVar40 != 0) {
        pvVar48 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
        return pvVar48;
      }
      iVar40 = stbi__hdr_test(s);
      if (iVar40 != 0) {
        data_00 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar58 = stbi__hdr_to_ldr(data_00,*x,*y,req_comp);
        return psVar58;
      }
      iVar40 = stbi__tga_test(s);
      if (iVar40 != 0) {
        pvVar48 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar48;
      }
      pcVar46 = "Image not of any known type, or corrupt";
LAB_0015a01d:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar46;
    }
    else {
      if (4 < (uint)req_comp) {
        pcVar46 = "Internal error";
        goto LAB_0015a01d;
      }
      local_88a8._0_8_ = s;
      iVar40 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      uVar7 = local_88a8._0_8_;
      if (iVar40 == 0) {
        psVar50 = (stbi__context *)0x0;
LAB_0015b71f:
        free(local_88a8.history);
        free(local_88a8.background);
        psVar45 = (stbi__jpeg *)local_88a8.out;
        goto LAB_0015ba0f;
      }
      iVar40 = 8;
      if ((8 < local_88a8.flags) && (iVar40 = 0x10, local_88a8.flags != 0x10)) {
        pcVar46 = "PNG not supported: unsupported color depth";
        goto LAB_0015a01d;
      }
      ri->bits_per_channel = iVar40;
      psVar50 = (stbi__context *)local_88a8.history;
      if ((req_comp == 0) || (iVar40 = *(int *)(local_88a8._0_8_ + 0xc), iVar40 == req_comp)) {
LAB_0015b6fa:
        *x = *(stbi__uint32 *)uVar7;
        *y = *(stbi__uint32 *)(uVar7 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar7 + 8);
        }
        local_88a8.history = (stbi_uc *)0x0;
        goto LAB_0015b71f;
      }
      if (local_88a8.flags < 9) {
        psVar50 = (stbi__context *)
                  stbi__convert_format
                            (local_88a8.history,iVar40,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                             *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      else {
        psVar50 = (stbi__context *)
                  stbi__convert_format16
                            ((stbi__uint16 *)local_88a8.history,iVar40,req_comp,
                             *(stbi__uint32 *)local_88a8._0_8_,
                             *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      *(int *)(uVar7 + 0xc) = req_comp;
      if (psVar50 != (stbi__context *)0x0) goto LAB_0015b6fa;
    }
LAB_0015a026:
    psVar50 = (stbi__context *)0x0;
  }
  return psVar50;
LAB_0015b2d3:
  bVar78 = false;
LAB_0015b2d5:
  if (!bVar78) goto LAB_0015b9fa;
LAB_0015b2dd:
  bVar39 = psVar45->marker;
LAB_0015b2e5:
  if (bVar39 != 0xff) goto LAB_0015a126;
LAB_0015b2ed:
  do {
    psVar50 = psVar45->s;
    if ((psVar50->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0015b30d:
      if (psVar50->img_buffer_end <= psVar50->img_buffer) goto LAB_0015a126;
    }
    else {
      iVar40 = (*(psVar50->io).eof)(psVar50->io_user_data);
      if (iVar40 != 0) {
        if (psVar50->read_from_callbacks != 0) goto LAB_0015b30d;
        goto LAB_0015a126;
      }
    }
    psVar50 = psVar45->s;
    psVar58 = psVar50->img_buffer;
    if (psVar50->img_buffer_end <= psVar58) {
      if (psVar50->read_from_callbacks == 0) goto LAB_0015b2ed;
      stbi__refill_buffer(psVar50);
      psVar58 = psVar50->img_buffer;
    }
    psVar50->img_buffer = psVar58 + 1;
  } while (*psVar58 != 0xff);
  psVar50 = psVar45->s;
  psVar58 = psVar50->img_buffer;
  if (psVar58 < psVar50->img_buffer_end) {
LAB_0015b385:
    psVar50->img_buffer = psVar58 + 1;
    sVar38 = *psVar58;
  }
  else {
    if (psVar50->read_from_callbacks != 0) {
      stbi__refill_buffer(psVar50);
      psVar58 = psVar50->img_buffer;
      goto LAB_0015b385;
    }
    sVar38 = '\0';
  }
  psVar45->marker = sVar38;
LAB_0015a126:
  bVar39 = stbi__get_marker(psVar45);
  goto LAB_0015a0ce;
LAB_0015c68f:
  paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar44 - 0x10);
  psVar45->code_bits = uVar44 - 0x10;
LAB_0015b9ea:
  *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
  goto LAB_0015b9fa;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}